

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalReserve(RepeatedPtrFieldBase *this,int n)

{
  bool bVar1;
  int iVar2;
  Rep *pRVar3;
  RepeatedPtrFieldBase *local_40;
  void **elements;
  int n_local;
  RepeatedPtrFieldBase *this_local;
  
  iVar2 = Capacity(this);
  if (iVar2 < n) {
    iVar2 = Capacity(this);
    this_local = (RepeatedPtrFieldBase *)InternalExtend(this,n - iVar2);
  }
  else {
    bVar1 = using_sso(this);
    local_40 = this;
    if (!bVar1) {
      pRVar3 = rep(this);
      local_40 = (RepeatedPtrFieldBase *)pRVar3->elements;
    }
    this_local = (RepeatedPtrFieldBase *)(&local_40->tagged_rep_or_elem_ + this->current_size_);
  }
  return &this_local->tagged_rep_or_elem_;
}

Assistant:

inline void** InternalReserve(int n) {
    if (n <= Capacity()) {
      void** elements = using_sso() ? &tagged_rep_or_elem_ : rep()->elements;
      return elements + current_size_;
    }
    return InternalExtend(n - Capacity());
  }